

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.h
# Opt level: O0

void __thiscall rcnb::decoder::decode(decoder *this,wistream *istream_in,ostream *ostream_in)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  ptrdiff_t pVar6;
  char *in_RDX;
  wchar_t *in_RSI;
  long in_RDI;
  ulong uVar7;
  long codelength;
  long plainlength;
  wchar_t *code;
  char *plaintext;
  int N;
  char *in_stack_ffffffffffffff98;
  decoder *in_stack_ffffffffffffffa0;
  wchar_t *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  initialize((decoder *)0x1042e2);
  iVar1 = *(int *)(in_RDI + 0x18);
  uVar7 = (ulong)iVar1;
  if ((long)uVar7 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar7);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(iVar1 * 3);
  uVar7 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar7);
  do {
    std::wistream::read(in_RSI,(long)pvVar5);
    std::wistream::gcount();
    pVar6 = decode((decoder *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
    std::ostream::write(in_RDX,(long)pvVar4);
    uVar3 = std::wios::good();
    in_stack_ffffffffffffffb7 = (uVar3 & 1) != 0 && 0 < pVar6;
  } while ((bool)in_stack_ffffffffffffffb7);
  decode_end(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::ostream::write(in_RDX,(long)pvVar4);
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

void decode(std::wistream& istream_in, std::ostream& ostream_in)
    {
        initialize();

        const int N = _buffersize;
        char* plaintext = new char[N];
        auto code = new wchar_t[3 * N];
        long plainlength;
        long codelength;

        do {
            istream_in.read(code, N);
            codelength = istream_in.gcount();

            plainlength = decode(code, codelength, plaintext);
            ostream_in.write(plaintext, plainlength);
        } while (istream_in.good() && plainlength > 0);

        plainlength = decode_end(plaintext);
        ostream_in.write(plaintext, plainlength);

        delete[] code;
        delete[] plaintext;
    }